

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O1

void * parseElement(SymbolContext<char> *ctx)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  XMLElement *this;
  XMLElement *pXVar6;
  pointer ppVar7;
  pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  string n;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this = (XMLElement *)operator_new(0x88);
  XMLElement::XMLElement(this,ctx);
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->m_name)._M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar5 == 0) {
    ppVar3 = (this->m_body).m_elements.
             super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = (this->m_body).m_elements.
                  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1)
    {
      iVar5 = std::__cxx11::string::compare((char *)ppVar7);
      if (iVar5 == 0) goto LAB_0010f431;
    }
    ppVar7 = (pointer)0x0;
LAB_0010f431:
    if (ppVar7 == (pointer)0x0) {
LAB_0010f451:
      std::
      vector<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&(this->m_body).m_elements);
      pcVar2 = (this->m_body).m_content._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(this->m_body).m_content.field_2) {
        operator_delete(pcVar2);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&(this->m_attributes)._M_t);
      pcVar2 = (this->m_name)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(this->m_name).field_2) {
        operator_delete(pcVar2);
      }
      operator_delete(this);
      pXVar6 = (XMLElement *)operator_new(0x88);
      (pXVar6->m_name)._M_dataplus._M_p = (pointer)&(pXVar6->m_name).field_2;
      std::__cxx11::string::_M_construct<char*>((string *)pXVar6,local_50,local_50 + local_48);
      p_Var1 = &(pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bVar4 = false;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pXVar6->m_body).m_content._M_dataplus._M_p = (pointer)&(pXVar6->m_body).m_content.field_2;
      (pXVar6->m_body).m_content._M_string_length = 0;
      (pXVar6->m_body).m_content.field_2._M_local_buf[0] = '\0';
      (pXVar6->m_body).m_elements.
      super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pXVar6->m_body).m_elements.
      super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pXVar6->m_body).m_elements.
      super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      pXVar6 = (XMLElement *)&(ppVar7->first).m_body;
      iVar5 = std::__cxx11::string::compare((char *)pXVar6);
      if (iVar5 != 0) goto LAB_0010f451;
      bVar4 = true;
    }
    if (!bVar4) goto LAB_0010f508;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_50);
    if ((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_50), iVar5 == 0)) ||
        (iVar5 = std::__cxx11::string::compare((char *)&local_50), iVar5 == 0)) ||
       (((iVar5 = std::__cxx11::string::compare((char *)&local_50), iVar5 == 0 ||
         (iVar5 = std::__cxx11::string::compare((char *)&local_50), iVar5 == 0)) ||
        ((iVar5 = std::__cxx11::string::compare((char *)&local_50), iVar5 == 0 ||
         (iVar5 = std::__cxx11::string::compare((char *)&local_50), iVar5 == 0)))))) {
      std::
      vector<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&(this->m_body).m_elements);
      pcVar2 = (this->m_body).m_content._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(this->m_body).m_content.field_2) {
        operator_delete(pcVar2);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&(this->m_attributes)._M_t);
      pcVar2 = (this->m_name)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(this->m_name).field_2) {
        operator_delete(pcVar2);
      }
      operator_delete(this);
      pXVar6 = (XMLElement *)operator_new(0x88);
      (pXVar6->m_name)._M_dataplus._M_p = (pointer)&(pXVar6->m_name).field_2;
      std::__cxx11::string::_M_construct<char*>((string *)pXVar6,local_50,local_50 + local_48);
      p_Var1 = &(pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (pXVar6->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pXVar6->m_body).m_content._M_dataplus._M_p = (pointer)&(pXVar6->m_body).m_content.field_2;
      (pXVar6->m_body).m_content._M_string_length = 0;
      (pXVar6->m_body).m_content.field_2._M_local_buf[0] = '\0';
      (pXVar6->m_body).m_elements.
      super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pXVar6->m_body).m_elements.
      super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pXVar6->m_body).m_elements.
      super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_0010f508;
    }
  }
  pXVar6 = this;
LAB_0010f508:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return pXVar6;
}

Assistant:

void *parseElement(const SymbolContext<char>& ctx)
{
    XMLElement *elem = new XMLElement(ctx);

    std::string n = elem->get_name();
    if (n == "article")
    {
        const XMLElement *year = elem->get_element("year");
        if (year != nullptr && year->get_content() == "1990")
        {
          // count++
        }
        else
        {
            delete elem;
            return new XMLElement(n);
        }
    }
    else if (n == "inproceedings" || n == "proceedings" || n == "book" || n == "incollection" || n == "phdthesis" || n == "mastersthesis" || n == "www")
    {
        delete elem;
        return new XMLElement(n);
    }
    return elem;
}